

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O0

void __thiscall
glslang::TIntermTraverser::incrementDepth(TIntermTraverser *this,TIntermNode *current)

{
  int *piVar1;
  TIntermNode *local_18;
  TIntermNode *current_local;
  TIntermTraverser *this_local;
  
  this->depth = this->depth + 1;
  local_18 = current;
  current_local = (TIntermNode *)this;
  piVar1 = std::max<int>(&this->maxDepth,&this->depth);
  this->maxDepth = *piVar1;
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
            (&(this->path).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>,
             &local_18);
  return;
}

Assistant:

void incrementDepth(TIntermNode *current)
    {
        depth++;
        maxDepth = (std::max)(maxDepth, depth);
        path.push_back(current);
    }